

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::begin__transparent
          (LibraryEffectsLoader *this,transparent__AttributeData *attributeData)

{
  ENUM__fx_opaque opaque;
  transparent__AttributeData *attributeData_local;
  LibraryEffectsLoader *this_local;
  
  switch(attributeData->opaque) {
  case ENUM__fx_opaque__A_ONE:
    this->mOpaqueMode = A_ONE;
    break;
  case ENUM__fx_opaque__A_ZERO:
    this->mOpaqueMode = A_ZERO;
    break;
  case ENUM__fx_opaque__RGB_ONE:
    this->mOpaqueMode = RGB_ONE;
    break;
  case ENUM__fx_opaque__RGB_ZERO:
    this->mOpaqueMode = RGB_ZERO;
    break;
  default:
    this->mOpaqueMode = UNSPECIFIED_OPAQUE;
  }
  this->mCurrentShaderParameterType = SHADER_PARAMETER_TRANSPARENT;
  return true;
}

Assistant:

bool LibraryEffectsLoader::begin__transparent ( const transparent__AttributeData& attributeData )
	{
		ENUM__fx_opaque opaque = attributeData.opaque;
		switch ( opaque )
		{
        case ENUM__fx_opaque__A_ZERO:
            mOpaqueMode = A_ZERO;
            break;
		case ENUM__fx_opaque__A_ONE:
			mOpaqueMode = A_ONE;
			break;
		case ENUM__fx_opaque__RGB_ZERO:
			mOpaqueMode = RGB_ZERO;
			break;
        case ENUM__fx_opaque__RGB_ONE:
            mOpaqueMode = RGB_ONE;
            break;
		default:
			mOpaqueMode = UNSPECIFIED_OPAQUE;
			break;
		}
		mCurrentShaderParameterType = SHADER_PARAMETER_TRANSPARENT; 
		return true;
	}